

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

uint8_t * __thiscall
Lodtalk::MethodAssembler::PushLiteralVariable::encode(PushLiteralVariable *this,uint8_t *buffer)

{
  uint8_t *puVar1;
  uint8_t *buffer_local;
  PushLiteralVariable *this_local;
  
  if (this->index < 0x10) {
    this_local = (PushLiteralVariable *)(buffer + 1);
    *buffer = (char)this->index + '\x10';
  }
  else {
    puVar1 = InstructionNode::encodeExtA
                       (&this->super_InstructionNode,buffer,(long)(this->index / 0x100));
    *puVar1 = 0xe3;
    this_local = (PushLiteralVariable *)(puVar1 + 2);
    puVar1[1] = (uint8_t)(this->index % 0x100);
  }
  return (uint8_t *)this_local;
}

Assistant:

virtual uint8_t *encode(uint8_t *buffer)
	{
		if(index < BytecodeSet::PushLiteralVariableShortRangeSize)
		{
			*buffer++ = uint8_t(BytecodeSet::PushLiteralVariableShortFirst + index);
			return buffer;
		}

        buffer = encodeExtA(buffer, index / 256);
        *buffer++ = BytecodeSet::PushLiteralVariable;
        *buffer++ = index % 256;
        return buffer;
	}